

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O3

FileBufSlot * read_jpeg_file(FileReader data)

{
  FILE *__stream;
  size_t __n;
  FileBufSlot *pFVar1;
  char *__ptr;
  size_t sVar2;
  MppBuffer hw_buf;
  MppBuffer local_38;
  
  __stream = *data;
  __n = *(size_t *)((long)data + 8);
  local_38 = (MppBuffer)0x0;
  pFVar1 = (FileBufSlot *)mpp_osal_calloc("read_jpeg_file",0x28);
  mpp_buffer_get_with_tag
            (*(undefined8 *)((long)data + 0x50),&local_38,*(undefined8 *)((long)data + 8),
             "mpi_dec_utils","read_jpeg_file");
  if ((local_38 != (MppBuffer)0x0) ||
     (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"hw_buf","read_jpeg_file",0x9c
                ), (DAT_001142d3 & 0x10) == 0)) {
    __ptr = (char *)mpp_buffer_get_ptr_with_caller(local_38,"read_jpeg_file");
    pFVar1->data = __ptr;
    if (__ptr == (char *)0x0) {
      _mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"slot->data","read_jpeg_file",
                 0x9f);
      if ((DAT_001142d3 & 0x10) != 0) goto LAB_00107a5e;
      __ptr = pFVar1->data;
    }
    sVar2 = fread(__ptr,1,__n,__stream);
    if ((sVar2 == __n) ||
       (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"read_size == buf_size",
                   "read_jpeg_file",0xa2), (DAT_001142d3 & 0x10) == 0)) {
      *(long *)((long)data + 0x40) = *(long *)((long)data + 0x40) + sVar2;
      *(size_t *)((long)data + 0x48) = sVar2;
      pFVar1->buf = local_38;
      pFVar1->size = sVar2;
      pFVar1->eos = 1;
      return pFVar1;
    }
  }
LAB_00107a5e:
  abort();
}

Assistant:

static FileBufSlot *read_jpeg_file(FileReader data)
{
    FileReaderImpl *impl = (FileReaderImpl*)data;
    FILE *fp = impl->fp_input;
    size_t read_size = 0;
    size_t buf_size = impl->file_size;
    MppBuffer hw_buf = NULL;
    FileBufSlot *slot = mpp_calloc(FileBufSlot, 1);

    mpp_buffer_get(impl->group, &hw_buf, impl->file_size);
    mpp_assert(hw_buf);

    slot->data = mpp_buffer_get_ptr(hw_buf);
    mpp_assert(slot->data);
    read_size = fread(slot->data, 1, buf_size, fp);

    mpp_assert(read_size == buf_size);

    impl->read_total += read_size;
    impl->read_size = read_size;

    slot->buf   = hw_buf;
    slot->size  = read_size;
    slot->eos   = 1;

    return slot;
}